

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

int __thiscall ON_String::Find(ON_String *this,char utf8_single_byte_c)

{
  int iVar1;
  undefined8 in_RAX;
  char s [2];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  iVar1 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c);
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    uStack_18 = (ulong)CONCAT16(utf8_single_byte_c,(undefined6)uStack_18);
    iVar1 = Find(this,(char *)((long)&uStack_18 + 6),0);
  }
  return iVar1;
}

Assistant:

int ON_String::Find(char utf8_single_byte_c) const
{
	// find first single character
  if (ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c))
  {
    char s[2];
    s[0] = utf8_single_byte_c;
    s[1] = 0;
    return Find(s);
  }
  return -1;
}